

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::_cp
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  bool bVar1;
  error_flags eVar2;
  long in_RSI;
  long in_RDI;
  size_t in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  Location *in_stack_ffffffffffffff30;
  undefined8 local_c0;
  char (*in_stack_ffffffffffffff70) [47];
  size_t local_88;
  size_t in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  Location *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  size_t local_38;
  size_t sStack_30;
  char *local_28;
  Location *pLStack_20;
  
  if (*(long *)(in_RSI + 0x980) == in_RSI) {
    if (0x10 < *(ulong *)(in_RSI + 0x990)) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff30 = in_stack_ffffffffffffff90;
      in_stack_ffffffffffffff28 = in_stack_ffffffffffffff88;
      in_stack_ffffffffffffff20 = in_stack_ffffffffffffff80;
      loc_01.super_LineCol.line = (size_t)in_stack_ffffffffffffff28;
      loc_01.super_LineCol.offset = in_stack_ffffffffffffff20;
      loc_01.super_LineCol.col = (size_t)in_stack_ffffffffffffff30;
      loc_01.name.str = (char *)in_stack_ffffffffffffff98;
      loc_01.name.len = in_stack_ffffffffffffffa0;
      in_stack_ffffffffffffff80 = in_stack_ffffffffffffff20;
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffff28;
      in_stack_ffffffffffffff90 = in_stack_ffffffffffffff30;
      error<36ul>((char (*) [36])in_stack_ffffffffffffff70,loc_01);
      in_stack_ffffffffffffff18 = local_88;
    }
    if (*(ulong *)(in_RSI + 0x990) < *(ulong *)(in_RSI + 0x988)) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      loc_02.super_LineCol.line = (size_t)in_stack_ffffffffffffff88;
      loc_02.super_LineCol.offset = in_stack_ffffffffffffff80;
      loc_02.super_LineCol.col = (size_t)in_stack_ffffffffffffff90;
      loc_02.name.str = (char *)in_stack_ffffffffffffff98;
      loc_02.name.len = in_stack_ffffffffffffffa0;
      error<47ul>(in_stack_ffffffffffffff70,loc_02);
    }
  }
  else {
    if (*(ulong *)(in_RSI + 0x990) < 0x11) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff88;
      loc.super_LineCol.offset = in_stack_ffffffffffffff80;
      loc.super_LineCol.col = (size_t)in_stack_ffffffffffffff90;
      loc.name.str = (char *)in_stack_ffffffffffffff98;
      loc.name.len = in_stack_ffffffffffffffa0;
      error<35ul>((char (*) [35])in_stack_ffffffffffffff70,loc);
      in_stack_ffffffffffffff18 = local_38;
      in_stack_ffffffffffffff20 = sStack_30;
      in_stack_ffffffffffffff28 = local_28;
      in_stack_ffffffffffffff30 = pLStack_20;
    }
    if (*(ulong *)(in_RSI + 0x990) < *(ulong *)(in_RSI + 0x988)) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      loc_00.super_LineCol.line = (size_t)in_stack_ffffffffffffff88;
      loc_00.super_LineCol.offset = in_stack_ffffffffffffff80;
      loc_00.super_LineCol.col = (size_t)in_stack_ffffffffffffff90;
      loc_00.name.str = (char *)in_stack_ffffffffffffff98;
      loc_00.name.len = in_stack_ffffffffffffffa0;
      error<47ul>(in_stack_ffffffffffffff70,loc_00);
    }
  }
  memcpy(*(void **)(in_RDI + 0x980),*(void **)(in_RSI + 0x980),*(long *)(in_RSI + 0x988) * 0x98);
  *(undefined8 *)(in_RDI + 0x988) = *(undefined8 *)(in_RSI + 0x988);
  if (*(ulong *)(in_RSI + 0x988) < 0x10) {
    local_c0 = 0x10;
  }
  else {
    local_c0 = *(undefined8 *)(in_RSI + 0x988);
  }
  *(undefined8 *)(in_RDI + 0x990) = local_c0;
  *(undefined8 *)(in_RDI + 0x998) = *(undefined8 *)(in_RSI + 0x998);
  *(undefined8 *)(in_RDI + 0x9a0) = *(undefined8 *)(in_RSI + 0x9a0);
  *(undefined8 *)(in_RDI + 0x9a8) = *(undefined8 *)(in_RSI + 0x9a8);
  *(undefined8 *)(in_RDI + 0x9b0) = *(undefined8 *)(in_RSI + 0x9b0);
  return;
}

Assistant:

void stack<T, N>::_cp(stack const* C4_RESTRICT that)
{
    if(that->m_stack != that->m_buf)
    {
        RYML_ASSERT(that->m_capacity > N);
        RYML_ASSERT(that->m_size <= that->m_capacity);
    }
    else
    {
        RYML_ASSERT(that->m_capacity <= N);
        RYML_ASSERT(that->m_size <= that->m_capacity);
    }
    memcpy(m_stack, that->m_stack, that->m_size * sizeof(T));
    m_size = that->m_size;
    m_capacity = that->m_size < N ? N : that->m_size;
    m_callbacks = that->m_callbacks;
}